

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

void hd_map_remove(nghttp2_hd_map *map,nghttp2_hd_entry *ent)

{
  nghttp2_hd_entry **local_20;
  nghttp2_hd_entry **dst;
  nghttp2_hd_entry *ent_local;
  nghttp2_hd_map *map_local;
  
  local_20 = map->table + (ent->hash & 0x7f);
  while( true ) {
    if (*local_20 == (nghttp2_hd_entry *)0x0) {
      return;
    }
    if (*local_20 == ent) break;
    local_20 = &(*local_20)->next;
  }
  *local_20 = ent->next;
  ent->next = (nghttp2_hd_entry *)0x0;
  return;
}

Assistant:

static void hd_map_remove(nghttp2_hd_map *map, nghttp2_hd_entry *ent) {
  nghttp2_hd_entry **dst;

  dst = &map->table[ent->hash & (HD_MAP_SIZE - 1)];

  for (; *dst; dst = &(*dst)->next) {
    if (*dst != ent) {
      continue;
    }

    *dst = ent->next;
    ent->next = NULL;
    return;
  }
}